

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fMultisampleTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::CommonEdgeCase::CommonEdgeCase
          (CommonEdgeCase *this,Context *context,char *name,char *description,CaseType caseType,
          int numFboSamples)

{
  int desiredViewportSize;
  int local_88;
  int local_80;
  FboParams local_3c;
  int local_30;
  CaseType local_2c;
  int numFboSamples_local;
  CaseType caseType_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  CommonEdgeCase *this_local;
  
  desiredViewportSize = 0x20;
  if (caseType == CASETYPE_SMALL_QUADS) {
    desiredViewportSize = 0x80;
  }
  local_30 = numFboSamples;
  local_2c = caseType;
  _numFboSamples_local = description;
  description_local = name;
  name_local = (char *)context;
  context_local = (Context *)this;
  if (numFboSamples < 0) {
    MultisampleCase::FboParams::FboParams(&local_3c);
  }
  else {
    MultisampleCase::FboParams::FboParams(&local_3c,numFboSamples,false,false);
  }
  MultisampleCase::MultisampleCase
            (&this->super_MultisampleCase,context,name,description,desiredViewportSize,&local_3c);
  (this->super_MultisampleCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__CommonEdgeCase_032a8aa8;
  this->m_caseType = local_2c;
  if (local_2c == CASETYPE_SMALL_QUADS) {
    local_80 = getIterationCount((this->super_MultisampleCase).super_TestCase.super_TestCase.
                                 super_TestNode.m_testCtx,0x10);
  }
  else {
    if (local_2c == CASETYPE_BIGGER_THAN_VIEWPORT_QUAD) {
      local_88 = getIterationCount((this->super_MultisampleCase).super_TestCase.super_TestCase.
                                   super_TestNode.m_testCtx,0x40);
    }
    else {
      local_88 = 8;
    }
    local_80 = local_88;
  }
  this->m_numIterations = local_80;
  this->m_currentIteration = 0;
  return;
}

Assistant:

CommonEdgeCase::CommonEdgeCase (Context& context, const char* name, const char* description, CaseType caseType, int numFboSamples)
	: MultisampleCase		(context, name, description, caseType == CASETYPE_SMALL_QUADS ? 128 : 32, numFboSamples >= 0 ? FboParams(numFboSamples, false, false) : FboParams())
	, m_caseType			(caseType)
	, m_numIterations		(caseType == CASETYPE_SMALL_QUADS					? getIterationCount(m_testCtx, DEFAULT_SMALL_QUADS_ITERATIONS)
							: caseType == CASETYPE_BIGGER_THAN_VIEWPORT_QUAD	? getIterationCount(m_testCtx, DEFAULT_BIGGER_THAN_VIEWPORT_QUAD_ITERATIONS)
							: 8)
	, m_currentIteration	(0)
{
}